

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O1

unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> __thiscall
duckdb::PhysicalOrder::GetLocalSourceState
          (PhysicalOrder *this,ExecutionContext *context,GlobalSourceState *gstate_p)

{
  long *plVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  long in_RCX;
  
  pp_Var3 = (_func_int **)operator_new(0x18);
  *pp_Var3 = (_func_int *)&PTR__PhysicalOrderLocalSourceState_024a76d8;
  LOCK();
  plVar1 = (long *)(in_RCX + 0x50);
  p_Var2 = (_func_int *)*plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  pp_Var3[1] = p_Var2;
  pp_Var3[2] = (_func_int *)0x0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var3;
  return (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)
         (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)this;
}

Assistant:

unique_ptr<LocalSourceState> PhysicalOrder::GetLocalSourceState(ExecutionContext &context,
                                                                GlobalSourceState &gstate_p) const {
	auto &gstate = gstate_p.Cast<PhysicalOrderGlobalSourceState>();
	return make_uniq<PhysicalOrderLocalSourceState>(gstate);
}